

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

void run_ecmult_multi_bench(bench_data *data,size_t count,int includes_g,int num_iters)

{
  ulong uVar1;
  ulong uVar2;
  secp256k1_scalar *psVar3;
  int in_ECX;
  int in_EDX;
  ulong in_RSI;
  bench_data *in_RDI;
  size_t i;
  secp256k1_scalar total;
  secp256k1_scalar tmp;
  size_t iter;
  size_t iters;
  char str [32];
  secp256k1_scalar *in_stack_00000798;
  secp256k1_scalar *in_stack_000007a0;
  secp256k1_gej *in_stack_000007a8;
  secp256k1_gej *in_stack_000007b0;
  long local_90;
  secp256k1_scalar *a;
  secp256k1_scalar *r;
  uint64_t in_stack_ffffffffffffff88;
  int count_00;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  secp256k1_scalar *in_stack_ffffffffffffff98;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_scalar *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  ulong local_48;
  int iter_00;
  char local_38 [36];
  int local_14;
  ulong local_10;
  bench_data *local_8;
  
  uVar2 = (ulong)(long)in_ECX / in_RSI + 1;
  in_RDI->count = in_RSI;
  in_RDI->includes_g = in_EDX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  hash_into_offset(in_RDI,in_RDI->count);
  for (local_48 = 0; count_00 = (int)(in_stack_ffffffffffffff88 >> 0x20), local_48 < uVar2;
      local_48 = local_48 + 1) {
    uVar1 = local_8->offset1;
    local_8->offset1 = uVar1 + 1;
    psVar3 = local_8->scalars + (uVar1 & 0x7fff);
    a = (secp256k1_scalar *)psVar3->d[0];
    r = (secp256k1_scalar *)psVar3->d[1];
    in_stack_ffffffffffffff88 = psVar3->d[2];
    in_stack_ffffffffffffff90 = (secp256k1_scalar *)psVar3->d[3];
    for (local_90 = 0; local_90 + 1U < local_10; local_90 = local_90 + 1) {
      local_8->offset2 = local_8->offset2 + 1;
      local_8->offset1 = local_8->offset1 + 1;
      secp256k1_scalar_mul
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      secp256k1_scalar_add
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    secp256k1_scalar_negate(r,a);
    secp256k1_ecmult(in_stack_000007b0,in_stack_000007a8,in_stack_000007a0,in_stack_00000798);
  }
  if (local_14 == 0) {
    sprintf(local_38,"ecmult_multi_%ip",local_10 & 0xffffffff);
    iter_00 = (int)uVar2;
  }
  else {
    sprintf(local_38,"ecmult_multi_%ip_g",(ulong)((int)local_10 - 1));
    iter_00 = (int)uVar2;
  }
  run_benchmark((char *)in_stack_ffffffffffffffb0,
                (_func_void_void_ptr_int *)in_stack_ffffffffffffffa8,
                (_func_void_void_ptr *)in_stack_ffffffffffffffa0,
                (_func_void_void_ptr_int *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                count_00,iter_00);
  return;
}

Assistant:

static void run_ecmult_multi_bench(bench_data* data, size_t count, int includes_g, int num_iters) {
    char str[32];
    static const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    size_t iters = 1 + num_iters / count;
    size_t iter;

    data->count = count;
    data->includes_g = includes_g;

    /* Compute (the negation of) the expected results directly. */
    hash_into_offset(data, data->count);
    for (iter = 0; iter < iters; ++iter) {
        secp256k1_scalar tmp;
        secp256k1_scalar total = data->scalars[(data->offset1++) % POINTS];
        size_t i = 0;
        for (i = 0; i + 1 < count; ++i) {
            secp256k1_scalar_mul(&tmp, &data->seckeys[(data->offset2++) % POINTS], &data->scalars[(data->offset1++) % POINTS]);
            secp256k1_scalar_add(&total, &total, &tmp);
        }
        secp256k1_scalar_negate(&total, &total);
        secp256k1_ecmult(&data->expected_output[iter], NULL, &zero, &total);
    }

    /* Run the benchmark. */
    if (includes_g) {
        sprintf(str, "ecmult_multi_%ip_g", (int)count - 1);
    } else {
        sprintf(str, "ecmult_multi_%ip", (int)count);
    }
    run_benchmark(str, bench_ecmult_multi, bench_ecmult_multi_setup, bench_ecmult_multi_teardown, data, 10, count * iters);
}